

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  byte bVar2;
  uint local_14;
  uint i;
  CPpmd7z_RangeDec *p_local;
  
  p->Bottom = 0;
  p->Low = 0;
  p->Range = 0xffffffff;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    UVar1 = p->Code;
    bVar2 = (*p->Stream->Read)(p->Stream);
    p->Code = UVar1 << 8 | (uint)bVar2;
  }
  return (Bool)(p->Code != 0xffffffff);
}

Assistant:

static Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Low = p->Bottom = 0;
  p->Range = 0xFFFFFFFF;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}